

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
::_reduce_boundary<std::initializer_list<unsigned_int>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
          *this,ID_index cellID,initializer_list<unsigned_int> *boundary,Dimension dim)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Index columnIndex;
  const_iterator puVar4;
  const_iterator puVar5;
  size_type sVar6;
  Column *pCVar7;
  reference pvVar8;
  int local_e8;
  Index local_b0;
  Index currentIndex;
  anon_class_8_1_5062c494 local_88;
  anon_class_8_1_5062c494 get_last;
  undefined1 local_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  Dimension dim_local;
  initializer_list<unsigned_int> *boundary_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
  *pCStack_18;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInF;
  
  boundary_local._4_4_ = cellID;
  pCStack_18 = this;
  this_local = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                *)__return_storage_ptr__;
  puVar4 = std::initializer_list<unsigned_int>::begin(boundary);
  puVar5 = std::initializer_list<unsigned_int>::end(boundary);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<unsigned_int_const*>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
             &chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,puVar4,puVar5);
  iVar2 = Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
          ::get_null_value<int>();
  column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = dim;
  if (dim == iVar2) {
    puVar4 = std::initializer_list<unsigned_int>::begin(boundary);
    puVar5 = std::initializer_list<unsigned_int>::end(boundary);
    if (puVar4 == puVar5) {
      local_e8 = 0;
    }
    else {
      sVar6 = std::initializer_list<unsigned_int>::size(boundary);
      local_e8 = (int)sVar6 + -1;
    }
    column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = local_e8;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  get_last.column._7_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  local_88.column =
       (Tmp_column *)
       &chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  puVar4 = std::initializer_list<unsigned_int>::begin(boundary);
  puVar5 = std::initializer_list<unsigned_int>::end(boundary);
  if (puVar4 == puVar5) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (value_type_conflict *)((long)&boundary_local + 4));
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
    ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                     *)this,(Tmp_column *)
                            &chainsInH.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                    column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  }
  else {
    uVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
            ::_reduce_boundary<std::initializer_list<unsigned_int>_>::anon_class_8_1_5062c494::
            operator()(&local_88);
    local_b0 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
               ::get_column_with_pivot
                         ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                           *)this,uVar3);
    while( true ) {
      pCVar7 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
               ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                             *)this,local_b0);
      bVar1 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
              ::is_paired(&pCVar7->super_Chain_column_option);
      if (!bVar1) break;
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
      ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                      *)this,(Tmp_column *)
                             &chainsInH.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,local_b0);
      bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&chainsInH.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
        ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                         *)this,boundary_local._4_4_,
                        (Tmp_column *)
                        &chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
        ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                         *)this,(Tmp_column *)
                                &chainsInH.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                        column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        goto LAB_0021191d;
      }
      uVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
              ::_reduce_boundary<std::initializer_list<unsigned_int>_>::anon_class_8_1_5062c494::
              operator()(&local_88);
      local_b0 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                 ::get_column_with_pivot
                           ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                             *)this,uVar3);
    }
    while (bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   empty((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&chainsInH.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage), ((bVar1 ^ 0xffU) & 1) != 0
          ) {
      uVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
              ::_reduce_boundary<std::initializer_list<unsigned_int>_>::anon_class_8_1_5062c494::
              operator()(&local_88);
      columnIndex = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                    ::get_column_with_pivot
                              ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                                *)this,uVar3);
      pCVar7 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
               ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                             *)this,columnIndex);
      bVar1 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
              ::is_paired(&pCVar7->super_Chain_column_option);
      if (bVar1) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
        ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                        *)this,(Tmp_column *)
                               &chainsInH.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,columnIndex);
      }
      else {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
        ::_reduce_by_F((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                        *)this,(Tmp_column *)
                               &chainsInH.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                       __return_storage_ptr__,columnIndex);
      }
    }
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
    ::_update_largest_death_in_F
              ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                *)this,__return_storage_ptr__);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
    ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                     *)this,boundary_local._4_4_,
                    (Tmp_column *)
                    &chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,0);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
    ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                     *)this,(Tmp_column *)
                            &chainsInH.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                    column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,*pvVar8);
  }
LAB_0021191d:
  get_last.column._7_1_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}